

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
pbrt::CoatedConductorMaterial::CoatedConductorMaterial
          (CoatedConductorMaterial *this,FloatTextureHandle *interfaceURoughness,
          FloatTextureHandle *interfaceVRoughness,FloatTextureHandle *thickness,
          FloatTextureHandle *interfaceEta,FloatTextureHandle *g,SpectrumTextureHandle *albedo,
          FloatTextureHandle *conductorURoughness,FloatTextureHandle *conductorVRoughness,
          SpectrumTextureHandle *conductorEta,SpectrumTextureHandle *k,
          FloatTextureHandle *displacement,bool remapRoughness,LayeredBxDFConfig config)

{
  FloatTextureHandle *in_RSI;
  long in_RDI;
  byte in_stack_00000038;
  undefined2 in_stack_00000040;
  undefined1 in_stack_00000042;
  FloatTextureHandle *in_stack_ffffffffffffff68;
  
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_stack_ffffffffffffff68);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_stack_ffffffffffffff68);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_stack_ffffffffffffff68);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_stack_ffffffffffffff68);
  *(byte *)(in_RDI + 0x58) = in_stack_00000038 & 1;
  *(undefined2 *)(in_RDI + 0x59) = in_stack_00000040;
  *(undefined1 *)(in_RDI + 0x5b) = in_stack_00000042;
  return;
}

Assistant:

CoatedConductorMaterial(FloatTextureHandle interfaceURoughness,
                            FloatTextureHandle interfaceVRoughness,
                            FloatTextureHandle thickness, FloatTextureHandle interfaceEta,
                            FloatTextureHandle g, SpectrumTextureHandle albedo,
                            FloatTextureHandle conductorURoughness,
                            FloatTextureHandle conductorVRoughness,
                            SpectrumTextureHandle conductorEta, SpectrumTextureHandle k,
                            FloatTextureHandle displacement, bool remapRoughness,
                            LayeredBxDFConfig config)
        : displacement(displacement),
          interfaceURoughness(interfaceURoughness),
          interfaceVRoughness(interfaceVRoughness),
          thickness(thickness),
          interfaceEta(interfaceEta),
          albedo(albedo),
          g(g),
          conductorURoughness(conductorURoughness),
          conductorVRoughness(conductorVRoughness),
          conductorEta(conductorEta),
          k(k),
          remapRoughness(remapRoughness),
          config(config) {}